

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::visitIfStatement(CheckerVisitor *this,IfStatement *ifstmt)

{
  pointer *ppSVar1;
  TreeOp TVar2;
  VarScope *this_00;
  iterator __position;
  Statement *pSVar3;
  Node *this_01;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  VarScope *pVVar8;
  long lVar9;
  uint uVar10;
  StackSlot local_40;
  VarScope *thenScope;
  VarScope *other;
  
  checkEmptyThenBody(this,ifstmt);
  checkDuplicateIfConditions(this,ifstmt);
  checkDuplicateIfBranches(this,ifstmt);
  checkAlwaysTrueOrFalse(this,ifstmt->_cond);
  checkSuspiciousFormatting(this,ifstmt->_thenB,&ifstmt->super_Statement);
  this_00 = this->currentScope;
  other = (VarScope *)0x0;
  iVar5 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  thenScope = (VarScope *)CONCAT44(extraout_var,iVar5);
  iVar5 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  if (ifstmt->_elseB != (Statement *)0x0) {
    iVar6 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
    other = (VarScope *)CONCAT44(extraout_var_01,iVar6);
  }
  local_40.sst = SST_NODE;
  __position._M_current =
       (this->nodeStack).
       super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_40.field_1 = (anon_union_8_2_108c9717_for_StackSlot_1)ifstmt;
  if (__position._M_current ==
      (this->nodeStack).
      super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::_M_realloc_insert<SQCompilation::CheckerVisitor::StackSlot>
              (&this->nodeStack,__position,&local_40);
  }
  else {
    *(ulong *)__position._M_current = (ulong)(uint)local_40._4_4_ << 0x20;
    ((__position._M_current)->field_1).n = (Node *)ifstmt;
    ppSVar1 = &(this->nodeStack).
               super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->currentScope = (VarScope *)CONCAT44(extraout_var_00,iVar5);
  Node::visit<SQCompilation::CheckerVisitor>(&ifstmt->_cond->super_Node,this);
  this->currentScope = this_00;
  pVVar8 = other;
  if (other == (VarScope *)0x0) {
    pVVar8 = this_00;
  }
  bVar4 = false;
  speculateIfConditionHeuristics(this,ifstmt->_cond,thenScope,pVVar8,false);
  this->currentScope = thenScope;
  Node::visit<SQCompilation::CheckerVisitor>(&ifstmt->_thenB->super_Node,this);
  pSVar3 = ifstmt->_thenB;
  TVar2 = (pSVar3->super_Node)._op;
  if (TVar2 < TO_EXPR_STMT) {
    if ((0x1a80U >> (TVar2 & TO_LE) & 1) == 0) {
      if (TVar2 != TO_BLOCK) goto LAB_00155c9e;
      uVar7 = (ulong)(uint)pSVar3[1].super_Node._coordinates.lineEnd;
      bVar4 = true;
      if (uVar7 != 0) {
        lVar9 = 0;
        do {
          uVar10 = *(int *)(*(long *)(*(long *)&pSVar3[1].super_Node._coordinates + lVar9) + 0x18) -
                   7;
          if ((uVar10 < 6) && ((0x35U >> (uVar10 & 0x1f) & 1) != 0)) {
            bVar4 = false;
            break;
          }
          lVar9 = lVar9 + 8;
        } while (uVar7 << 3 != lVar9);
      }
    }
  }
  else {
LAB_00155c9e:
    bVar4 = true;
  }
  this_01 = &ifstmt->_elseB->super_Node;
  if (this_01 == (Node *)0x0) {
LAB_00155cdf:
    ppSVar1 = &(this->nodeStack).
               super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + -1;
    if (bVar4) {
      if (other == (VarScope *)0x0) {
        VarScope::merge(this_00,thenScope);
        goto LAB_00155d16;
      }
      VarScope::merge(thenScope,other);
      pVVar8 = thenScope;
    }
    else {
      pVVar8 = other;
      if (other == (VarScope *)0x0) goto LAB_00155d16;
    }
    VarScope::copyFrom(this_00,pVVar8);
  }
  else {
    this->currentScope = other;
    Node::visit<SQCompilation::CheckerVisitor>(this_01,this);
    pSVar3 = ifstmt->_elseB;
    TVar2 = (pSVar3->super_Node)._op;
    if (TO_CONTINUE < TVar2) goto LAB_00155cdf;
    if ((0x1a80U >> (TVar2 & TO_LE) & 1) == 0) {
      if ((TVar2 == TO_BLOCK) &&
         (uVar7 = (ulong)(uint)pSVar3[1].super_Node._coordinates.lineEnd, uVar7 != 0)) {
        lVar9 = 0;
        do {
          uVar10 = *(uint *)(*(long *)(*(long *)&pSVar3[1].super_Node._coordinates + lVar9) + 0x18);
          if ((uVar10 < 0xd) && ((0x1a80U >> (uVar10 & 0x1f) & 1) != 0)) goto LAB_00155c37;
          lVar9 = lVar9 + 8;
        } while (uVar7 << 3 != lVar9);
      }
      goto LAB_00155cdf;
    }
LAB_00155c37:
    ppSVar1 = &(this->nodeStack).
               super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + -1;
    if (bVar4) {
      VarScope::copyFrom(this_00,thenScope);
    }
    if (other == (VarScope *)0x0) goto LAB_00155d16;
  }
  VarScope::~VarScope(other);
LAB_00155d16:
  VarScope::~VarScope(thenScope);
  this->currentScope = this_00;
  return;
}

Assistant:

void CheckerVisitor::visitIfStatement(IfStatement *ifstmt) {
  checkEmptyThenBody(ifstmt);
  checkDuplicateIfConditions(ifstmt);
  checkDuplicateIfBranches(ifstmt);
  checkAlwaysTrueOrFalse(ifstmt->condition());
  checkSuspiciousFormatting(ifstmt->thenBranch(), ifstmt);

  VarScope *trunkScope = currentScope;
  VarScope *thenScope = trunkScope->copy(arena);
  VarScope *dummyScope = trunkScope->copy(arena);
  VarScope *elseScope = ifstmt->elseBranch() ? trunkScope->copy(arena) : nullptr;

  nodeStack.push_back({ SST_NODE, ifstmt });

  currentScope = dummyScope;

  ifstmt->condition()->visit(this);

  currentScope = trunkScope;

  // pass fall-through branch to not lose effects
  speculateIfConditionHeuristics(ifstmt->condition(), thenScope, elseScope ? elseScope : trunkScope);

  currentScope = thenScope;

  ifstmt->thenBranch()->visit(this);

  bool isThenFT = isFallThroughBranch(ifstmt->thenBranch());
  bool isElseFT = true;

  if (ifstmt->elseBranch()) {
    currentScope = elseScope;
    ifstmt->elseBranch()->visit(this);
    isElseFT = isFallThroughBranch(ifstmt->elseBranch());
  }

  nodeStack.pop_back();

  if (isThenFT && isElseFT) {
    if (elseScope) {
      thenScope->merge(elseScope);
      trunkScope->copyFrom(thenScope);
    }
    else {
      trunkScope->merge(thenScope);
    }
  }
  else if (isThenFT) {
    trunkScope->copyFrom(thenScope);
  }
  else if (elseScope && isElseFT) {
    trunkScope->copyFrom(elseScope);
  }

  if (elseScope)
    elseScope->~VarScope();

  thenScope->~VarScope();
  currentScope = trunkScope;
}